

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O1

void __thiscall
duckdb::EnumColumnWriter::WriteVector
          (EnumColumnWriter *this,WriteStream *temp_writer,ColumnWriterStatistics *stats_p,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  char cVar1;
  InternalException *this_00;
  string local_40;
  
  cVar1 = *(char *)(*(long *)&this->field_0x10 + 0x29);
  if (cVar1 == '\x06') {
    WriteEnumInternal<unsigned_int>
              (this,temp_writer,input_column,chunk_start,chunk_end,
               (EnumWriterPageState *)page_state_p);
    return;
  }
  if (cVar1 != '\x04') {
    if (cVar1 == '\x02') {
      WriteEnumInternal<unsigned_char>
                (this,temp_writer,input_column,chunk_start,chunk_end,
                 (EnumWriterPageState *)page_state_p);
      return;
    }
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unsupported internal enum type","");
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  WriteEnumInternal<unsigned_short>
            (this,temp_writer,input_column,chunk_start,chunk_end,(EnumWriterPageState *)page_state_p
            );
  return;
}

Assistant:

void EnumColumnWriter::WriteVector(WriteStream &temp_writer, ColumnWriterStatistics *stats_p,
                                   ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
                                   idx_t chunk_end) {
	auto &page_state = page_state_p->Cast<EnumWriterPageState>();
	switch (Type().InternalType()) {
	case PhysicalType::UINT8:
		WriteEnumInternal<uint8_t>(temp_writer, input_column, chunk_start, chunk_end, page_state);
		break;
	case PhysicalType::UINT16:
		WriteEnumInternal<uint16_t>(temp_writer, input_column, chunk_start, chunk_end, page_state);
		break;
	case PhysicalType::UINT32:
		WriteEnumInternal<uint32_t>(temp_writer, input_column, chunk_start, chunk_end, page_state);
		break;
	default:
		throw InternalException("Unsupported internal enum type");
	}
}